

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.h
# Opt level: O3

int __thiscall soplex::NameSet::number(NameSet *this,char *str)

{
  int iVar1;
  char *pcVar2;
  int in_EDX;
  int __c;
  DataKey *k;
  Name nam;
  char *local_18;
  
  local_18 = str;
  pcVar2 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                     (&this->hashtab,(char *)&local_18,in_EDX);
  if ((int)pcVar2 < 0) {
    iVar1 = -1;
  }
  else {
    pcVar2 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                       (&this->hashtab,(char *)&local_18,__c);
    k = (DataKey *)0x0;
    if (-1 < (int)pcVar2) {
      k = (DataKey *)
          ((long)((this->hashtab).m_elem.data.
                  super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar2 & 0xffffffff)) + 8);
    }
    iVar1 = DataSet<int>::number(&this->set,k);
  }
  return iVar1;
}

Assistant:

int number(const char* str) const
   {
      const Name nam(str);

      if(hashtab.has(nam))
      {
         assert(hashtab.get(nam) != nullptr);
         return number(*hashtab.get(nam));
      }
      else
         return -1;
   }